

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O3

void __thiscall App::keyPressed(App *this,int key)

{
  bool towardsLeft;
  
  if (0x52 < key) {
    switch(key) {
    case 0x101:
      if ((this->state < 4) && (this->state != GAME)) {
        reset(this);
        this->state = GAME;
      }
    case 0x102:
    case 0x103:
    case 0x104:
    case 0x105:
      return;
    case 0x106:
      goto switchD_0012bb91_caseD_106;
    case 0x107:
switchD_0012bb91_caseD_107:
      towardsLeft = true;
      goto LAB_0012bbd4;
    case 0x109:
switchD_0012bb91_caseD_109:
      Character::startJumping(&this->character);
      return;
    default:
      if (key != 0x53) {
        if (key != 0x57) {
          return;
        }
        goto switchD_0012bb91_caseD_109;
      }
    case 0x108:
      Character::startDucking(&this->character);
      return;
    }
  }
  if (key == 0x20) goto switchD_0012bb91_caseD_109;
  if (key == 0x41) goto switchD_0012bb91_caseD_107;
  if (key != 0x44) {
    return;
  }
switchD_0012bb91_caseD_106:
  towardsLeft = false;
LAB_0012bbd4:
  Character::startRunning(&this->character,towardsLeft);
  return;
}

Assistant:

void App::keyPressed(int key) {
    switch (key) {
        case 263: // left arrow
        case 'A':
            character.startRunning(true);
            break;
        case 262: // right arrow
        case 'D':
            character.startRunning(false);
            break;
        case 265: // up arrow
        case 'W':
        case ' ':
            character.startJumping();
            break;
        case 264: // down arrow
        case 'S':
            character.startDucking();
            // bricks.clear(); // for debug
            break;
        case 257: // enter
            if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
                reset();
                state = GAME;
            }
    }
}